

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * __thiscall fmt::v7::format_int::format_signed<long>(format_int *this,long value)

{
  char *pcVar1;
  char *pcVar2;
  long in_RSI;
  byte bVar3;
  char *begin;
  bool negative;
  uint32_or_64_or_128_t<long> abs_value;
  unsigned_long in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar3 = in_RSI < 0;
  pcVar1 = format_unsigned<unsigned_long>
                     ((format_int *)CONCAT17(bVar3,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8);
  pcVar2 = pcVar1;
  if ((bVar3 & 1) != 0) {
    pcVar2 = pcVar1 + -1;
    pcVar1[-1] = '-';
  }
  return pcVar2;
}

Assistant:

char* format_signed(Int value) {
    auto abs_value = static_cast<detail::uint32_or_64_or_128_t<Int>>(value);
    bool negative = value < 0;
    if (negative) abs_value = 0 - abs_value;
    auto begin = format_unsigned(abs_value);
    if (negative) *--begin = '-';
    return begin;
  }